

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O3

bool crnlib::create_compressed_texture
               (crn_comp_params *params,crn_mipmap_params *mipmap_params,
               vector<unsigned_char> *comp_data,uint32 *pActual_quality_level,float *pActual_bitrate
               )

{
  vector<crnlib::mip_level_*> *pvVar1;
  uint uVar2;
  crn_uint32 *pcVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  void *pvVar5;
  mip_level **ppmVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  mip_level *this;
  image_u8 *p;
  uint uVar11;
  ulong uVar12;
  crn_uint32 *(*papcVar13) [16];
  crn_comp_params *pcVar14;
  crn_comp_params *pcVar15;
  crn_uint32 **ppcVar16;
  crn_file_type cVar17;
  uint uVar18;
  uint f;
  uint uVar19;
  crn_uint32 cVar20;
  mipmapped_texture work_tex;
  crn_comp_params new_params;
  face_vec local_12d8;
  crn_uint32 *(*local_12c0) [16];
  crn_comp_params *local_12b8;
  float *local_12b0;
  crn_comp_params *local_12a8;
  ulong local_12a0;
  vector<unsigned_char> *local_1298;
  uint32 *local_1290;
  crn_mipmap_params *local_1288;
  mipmapped_texture local_1280;
  crn_comp_params local_1238 [5];
  
  if (comp_data->m_size != 0) {
    comp_data->m_size = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  local_12b0 = pActual_bitrate;
  local_1298 = comp_data;
  local_1290 = pActual_quality_level;
  local_1288 = mipmap_params;
  mipmapped_texture::mipmapped_texture(&local_1280);
  lVar9 = 0x18;
  do {
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x40U + lVar9) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x48U + lVar9) = 0;
    *(undefined4 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x50U + lVar9) = 0xf;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x58U + lVar9) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x60U + lVar9) = 0;
    *(undefined8 *)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x68U + lVar9) = 0;
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x1218);
  uVar19 = params->m_faces;
  local_12b8 = params;
  if (uVar19 != 0) {
    local_12c0 = params->m_pImages;
    uVar11 = params->m_levels;
    uVar10 = (ulong)uVar11;
    local_12a8 = local_1238;
    uVar12 = 0;
    uVar18 = 0;
    do {
      local_12a0 = uVar12;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        uVar12 = 0;
        pcVar14 = local_12a8;
        do {
          uVar19 = params->m_width >> ((byte)uVar12 & 0x1f);
          cVar20 = uVar19 + (uVar19 == 0);
          uVar19 = params->m_height >> ((byte)uVar12 & 0x1f);
          cVar17 = uVar19 + (uVar19 == 0);
          pcVar3 = (*local_12c0)[uVar12];
          if (pcVar3 == (crn_uint32 *)0x0) {
            bVar7 = false;
            goto LAB_0014956d;
          }
          if (*(void **)&pcVar14->m_flags != (void *)0x0) {
            crnlib_free(*(void **)&pcVar14->m_flags);
            *(undefined8 *)&pcVar14->m_flags = 0;
            pcVar14->m_pImages[0][0] = (crn_uint32 *)0x0;
          }
          pcVar14->m_format = (crn_format)pcVar3;
          pcVar14->m_size_of_obj = cVar20;
          pcVar14->m_file_type = cVar17;
          pcVar14->m_faces = cVar20;
          pcVar14->m_width = cVar17 * cVar20;
          pcVar14->m_height = 0xf;
          if (uVar18 == 0) {
            bVar7 = image_utils::has_alpha((image_u8 *)pcVar14);
            uVar18 = (uint)bVar7;
          }
          uVar12 = uVar12 + 1;
          uVar11 = local_12b8->m_levels;
          uVar10 = (ulong)uVar11;
          pcVar14 = (crn_comp_params *)((long)pcVar14->m_pImages[0] + 8);
          params = local_12b8;
        } while (uVar12 < uVar10);
        uVar19 = local_12b8->m_faces;
      }
      uVar12 = local_12a0 + 1;
      local_12a8 = (crn_comp_params *)((long)(local_12a8->m_pImages + 5) + 0x58);
      local_12c0 = local_12c0 + 1;
    } while (uVar12 < uVar19);
    if (uVar19 != 0) {
      ppcVar16 = (crn_uint32 **)&local_1238[0].m_height;
      uVar12 = 0;
      do {
        if ((int)uVar10 != 0) {
          lVar9 = 0;
          do {
            *(uint *)((long)ppcVar16 + lVar9) =
                 *(uint *)((long)ppcVar16 + lVar9) & 0xfffffff7 | uVar18 << 3;
            lVar9 = lVar9 + 0x30;
          } while (uVar10 * 0x30 != lVar9);
        }
        uVar12 = uVar12 + 1;
        ppcVar16 = ppcVar16 + 0x60;
      } while (uVar12 != uVar19);
      local_12d8.m_p = (vector<crnlib::mip_level_*> *)0x0;
      local_12d8.m_size = 0;
      local_12d8.m_capacity = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_12d8,uVar19,uVar19 == 1,0x10,(object_mover)0x0,false);
      if (uVar19 != local_12d8.m_size) {
        memset(local_12d8.m_p + (local_12d8._8_8_ & 0xffffffff),0,
               (ulong)(uVar19 - local_12d8.m_size) << 4);
      }
      local_12d8.m_size = uVar19;
      uVar19 = params->m_faces;
      if (uVar19 != 0) {
        uVar10 = (ulong)params->m_levels;
        pcVar14 = local_1238;
        papcVar13 = (crn_uint32 *(*) [16])0x0;
        do {
          iVar8 = (int)uVar10;
          uVar10 = 0;
          if (iVar8 != 0) {
            uVar12 = 0;
            pcVar15 = pcVar14;
            local_12c0 = papcVar13;
            do {
              this = (mip_level *)crnlib_malloc(0x28);
              mip_level::mip_level(this);
              p = (image_u8 *)crnlib_malloc(0x30);
              p->m_width = 0;
              p->m_height = 0;
              p->m_pitch = 0;
              p->m_total = 0;
              p->m_comp_flags = 0xf;
              p->m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
              (p->m_pixel_buf).m_p = (color_quad<unsigned_char,_int> *)0x0;
              (p->m_pixel_buf).m_size = 0;
              (p->m_pixel_buf).m_capacity = 0;
              p->m_width = pcVar15->m_size_of_obj;
              pcVar15->m_size_of_obj = 0;
              cVar17 = p->m_height;
              p->m_height = pcVar15->m_file_type;
              pcVar15->m_file_type = cVar17;
              uVar2 = p->m_pitch;
              p->m_pitch = pcVar15->m_faces;
              pcVar15->m_faces = uVar2;
              uVar2 = p->m_total;
              p->m_total = pcVar15->m_width;
              pcVar15->m_width = uVar2;
              uVar2 = p->m_comp_flags;
              p->m_comp_flags = pcVar15->m_height;
              pcVar15->m_height = uVar2;
              p->m_pPixels = (color_quad<unsigned_char,_int> *)pcVar15->m_format;
              pcVar15->m_format = cCRNFmtDXT1;
              pcVar4 = (p->m_pixel_buf).m_p;
              (p->m_pixel_buf).m_p = *(color_quad<unsigned_char,_int> **)&pcVar15->m_flags;
              *(color_quad<unsigned_char,_int> **)&pcVar15->m_flags = pcVar4;
              uVar2 = (p->m_pixel_buf).m_size;
              (p->m_pixel_buf).m_size = *(uint *)pcVar15->m_pImages[0];
              *(uint *)pcVar15->m_pImages[0] = uVar2;
              uVar2 = (p->m_pixel_buf).m_capacity;
              (p->m_pixel_buf).m_capacity = *(uint *)((long)pcVar15->m_pImages[0] + 4);
              *(uint *)((long)pcVar15->m_pImages[0] + 4) = uVar2;
              mip_level::assign(this,p,PIXEL_FMT_INVALID,cDefaultOrientationFlags);
              pvVar1 = local_12d8.m_p + (long)papcVar13;
              uVar19 = local_12d8.m_p[(long)papcVar13].m_size;
              if (local_12d8.m_p[(long)papcVar13].m_capacity <= uVar19) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)pvVar1,uVar19 + 1,true,8,(object_mover)0x0,false);
                uVar19 = pvVar1->m_size;
              }
              pvVar1->m_p[uVar19] = this;
              pvVar1->m_size = uVar19 + 1;
              uVar12 = uVar12 + 1;
              uVar10 = (ulong)local_12b8->m_levels;
              pcVar15 = (crn_comp_params *)((long)pcVar15->m_pImages[0] + 8);
            } while (uVar12 < uVar10);
            uVar19 = local_12b8->m_faces;
            papcVar13 = local_12c0;
          }
          papcVar13 = (crn_uint32 *(*) [16])((long)*papcVar13 + 1);
          pcVar14 = (crn_comp_params *)((long)(pcVar14->m_pImages + 5) + 0x58);
        } while (papcVar13 < (undefined1 *)(ulong)uVar19);
      }
      goto LAB_00149521;
    }
  }
  local_12d8.m_p = (vector<crnlib::mip_level_*> *)0x0;
  local_12d8.m_size = 0;
  local_12d8.m_capacity = 0;
LAB_00149521:
  mipmapped_texture::assign(&local_1280,&local_12d8);
  pvVar1 = local_12d8.m_p;
  if (local_12d8.m_p != (vector<crnlib::mip_level_*> *)0x0) {
    uVar10 = local_12d8._8_8_ & 0xffffffff;
    if (uVar10 != 0) {
      lVar9 = 0;
      do {
        pvVar5 = *(void **)((long)&pvVar1->m_p + lVar9);
        if (pvVar5 != (void *)0x0) {
          crnlib_free(pvVar5);
        }
        lVar9 = lVar9 + 0x10;
      } while (uVar10 << 4 != lVar9);
    }
    crnlib_free(local_12d8.m_p);
  }
  bVar7 = true;
LAB_0014956d:
  lVar9 = 0x1200;
  do {
    pvVar5 = *(void **)((long)(local_1238[0].m_pImages + 0xffffffffffffffff) + 0x48U + lVar9);
    if (pvVar5 != (void *)0x0) {
      crnlib_free(pvVar5);
    }
    pcVar14 = local_12b8;
    lVar9 = lVar9 + -0x30;
  } while (lVar9 != 0);
  if (bVar7) {
    bVar7 = create_texture_mipmaps(&local_1280,local_12b8,local_1288,true);
    if (bVar7) {
      memcpy(local_1238,pcVar14,0x378);
      if ((ulong)local_1280.m_faces.m_size == 0) {
        local_1238[0].m_levels = 0;
        memset(local_1238[0].m_pImages,0,0x300);
      }
      else {
        local_1238[0].m_levels = (local_1280.m_faces.m_p)->m_size;
        papcVar13 = local_1238[0].m_pImages;
        uVar10 = 0;
        memset(papcVar13,0,0x300);
        uVar19 = (local_1280.m_faces.m_p)->m_size;
        do {
          if ((ulong)uVar19 != 0) {
            ppmVar6 = local_1280.m_faces.m_p[uVar10].m_p;
            uVar12 = 0;
            do {
              (*papcVar13)[uVar12] = (crn_uint32 *)ppmVar6[uVar12]->m_pImage->m_pPixels;
              uVar12 = uVar12 + 1;
            } while (uVar19 != uVar12);
          }
          uVar10 = uVar10 + 1;
          papcVar13 = papcVar13 + 1;
        } while (uVar10 != local_1280.m_faces.m_size);
      }
      bVar7 = create_compressed_texture(local_1238,local_1298,local_1290,local_12b0);
    }
    else {
      bVar7 = false;
    }
  }
  else {
    bVar7 = false;
    console::error("Failed creating DDS texture from crn_comp_params!");
  }
  mipmapped_texture::~mipmapped_texture(&local_1280);
  return bVar7;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, const crn_mipmap_params& mipmap_params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate)
    {
        comp_data.resize(0);
        if (pActual_bitrate)
        {
            *pActual_bitrate = 0.0f;
        }
        if (pActual_quality_level)
        {
            *pActual_quality_level = 0;
        }

        mipmapped_texture work_tex;
        if (!create_dds_tex(params, work_tex))
        {
            console::error("Failed creating DDS texture from crn_comp_params!");
            return false;
        }

        if (!create_texture_mipmaps(work_tex, params, mipmap_params, true))
        {
            return false;
        }

        crn_comp_params new_params(params);
        new_params.m_levels = work_tex.get_num_levels();
        memset(new_params.m_pImages, 0, sizeof(new_params.m_pImages));

        for (uint f = 0; f < work_tex.get_num_faces(); f++)
        {
            for (uint l = 0; l < work_tex.get_num_levels(); l++)
            {
                new_params.m_pImages[f][l] = (uint32*)work_tex.get_level(f, l)->get_image()->get_ptr();
            }
        }

        return create_compressed_texture(new_params, comp_data, pActual_quality_level, pActual_bitrate);
    }